

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::Arguments::Arguments(Arguments *this)

{
  value_type *in_RDI;
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffffe0;
  
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)0x140927);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

Arguments() {
    args_.push_back(NULL);
  }